

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O0

bool Config::parse(int argc,char **argv,List<Path> *rcFiles)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  OptionBase *pOVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  Type TVar8;
  FILE *pFVar9;
  String *pSVar10;
  char *pcVar11;
  size_t sVar12;
  reference this;
  char **ppcVar13;
  OptionBase *pOVar14;
  reference ppOVar15;
  option *poVar16;
  char *pcVar17;
  ulong uVar18;
  ulong local_1bc8;
  size_t i_5;
  Value local_1ba0;
  Value local_1b68;
  int local_1b2c;
  String local_1b28;
  Value local_1b08;
  String local_1ad0;
  Value local_1ab0;
  undefined1 local_1a78 [8];
  List<Value> vals;
  Value local_1a40;
  char *local_1a08;
  char *arg;
  Value val;
  size_t i_4;
  OptionBase *opt_1;
  int local_19b0;
  int ret;
  int idx;
  bool ok;
  String shortOpts;
  option *o;
  OptionBase *opt;
  size_t i_3;
  List<Config::OptionBase_*> optionPointers;
  StackBuffer<128UL,_option> options;
  size_t i_2;
  StackBuffer<128UL,_char_*> a;
  int local_50c;
  undefined1 local_508 [4];
  int i_1;
  String *local_4e8;
  String *first;
  undefined1 local_4c0 [8];
  List<String> split;
  char *ch;
  undefined1 local_498 [4];
  int read;
  char line [1024];
  FILE *f;
  size_t i;
  undefined1 local_68 [8];
  List<String> args;
  undefined1 local_40 [8];
  String error;
  List<Path> *rcFiles_local;
  char **argv_local;
  int argc_local;
  
  error.mString.field_2._8_8_ = rcFiles;
  String::String((String *)local_40,(char *)0x0,0xffffffffffffffff);
  Rct::findExecutablePath(*argv);
  List<String>::List((List<String> *)local_68);
  String::String((String *)&i,*argv,0xffffffffffffffff);
  List<String>::operator<<((List<String> *)local_68,(String *)&i);
  String::~String((String *)&i);
  for (f = (FILE *)0x0; pFVar9 = (FILE *)List<Path>::size((List<Path> *)error.mString.field_2._8_8_)
      , f < pFVar9; f = f + 1) {
    pSVar10 = &std::vector<Path,_std::allocator<Path>_>::at
                         ((vector<Path,_std::allocator<Path>_> *)error.mString.field_2._8_8_,
                          (size_type)f)->super_String;
    pcVar11 = String::constData(pSVar10);
    line._1016_8_ = fopen(pcVar11,"r");
    if ((FILE *)line._1016_8_ != (FILE *)0x0) {
      while (iVar7 = Rct::readLine((FILE *)line._1016_8_,local_498,0x400), iVar7 != -1) {
        split.super_vector<String,_std::allocator<String>_>.
        super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)local_498;
        while (iVar7 = isspace((int)(char)((split.super_vector<String,_std::allocator<String>_>.
                                            super__Vector_base<String,_std::allocator<String>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          mString)._M_dataplus), iVar7 != 0) {
          split.super_vector<String,_std::allocator<String>_>.
          super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)&((split.super_vector<String,_std::allocator<String>_>.
                           super__Vector_base<String,_std::allocator<String>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage)->mString).field_0x1;
        }
        if (((split.super_vector<String,_std::allocator<String>_>.
              super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage)->mString)._M_dataplus != (_Alloc_hider)0x23) {
          String::String((String *)&first,
                         (char *)split.super_vector<String,_std::allocator<String>_>.
                                 super__Vector_base<String,_std::allocator<String>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,0xffffffffffffffff);
          String::split((List<String> *)local_4c0,(String *)&first,' ',0);
          String::~String((String *)&first);
          bVar4 = List<String>::isEmpty((List<String> *)local_4c0);
          if (!bVar4) {
            local_4e8 = List<String>::first((List<String> *)local_4c0);
            sVar12 = String::size(local_4e8);
            if ((sVar12 == 1) ||
               ((sVar12 = String::size(local_4e8), 2 < sVar12 &&
                (cVar5 = String::at(local_4e8,1), cVar5 == '=')))) {
              String::prepend(local_4e8,'-');
            }
            else {
              pSVar10 = local_4e8;
              String::String((String *)local_508,"--",0xffffffffffffffff);
              String::prepend(pSVar10,(String *)local_508);
              String::~String((String *)local_508);
            }
            List<String>::operator+=((List<String> *)local_68,(List<String> *)local_4c0);
          }
          List<String>::~List((List<String> *)local_4c0);
        }
      }
      fclose((FILE *)line._1016_8_);
    }
  }
  for (local_50c = 1; local_50c < argc; local_50c = local_50c + 1) {
    String::String((String *)&a.mSize,argv[local_50c],0xffffffffffffffff);
    List<String>::append((List<String> *)local_68,(String *)&a.mSize);
    String::~String((String *)&a.mSize);
  }
  sVar12 = List<String>::size((List<String> *)local_68);
  StackBuffer<128UL,_char_*>::StackBuffer((StackBuffer<128UL,_char_*> *)&i_2,sVar12);
  for (options.mSize = 0; sVar12 = List<String>::size((List<String> *)local_68),
      options.mSize < sVar12; options.mSize = options.mSize + 1) {
    this = std::vector<String,_std::allocator<String>_>::at
                     ((vector<String,_std::allocator<String>_> *)local_68,options.mSize);
    pcVar11 = String::constData(this);
    pcVar11 = strdup(pcVar11);
    ppcVar13 = StackBuffer<128UL,_char_*>::operator[]
                         ((StackBuffer<128UL,_char_*> *)&i_2,(int)options.mSize);
    *ppcVar13 = pcVar11;
  }
  sVar12 = List<Config::OptionBase_*>::size(&sOptions);
  StackBuffer<128UL,_option>::StackBuffer
            ((StackBuffer<128UL,_option> *)
             &optionPointers.
              super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
              super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,sVar12 + 1);
  List<Config::OptionBase_*>::List((List<Config::OptionBase_*> *)&i_3);
  for (opt = (OptionBase *)0x0; pOVar3 = opt,
      pOVar14 = (OptionBase *)List<Config::OptionBase_*>::size(&sOptions), pOVar3 < pOVar14;
      opt = opt + 1) {
    ppOVar15 = std::vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>::at
                         (&sOptions.
                           super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                          ,(size_type)opt);
    o = (option *)*ppOVar15;
    if (*(long *)&o->has_arg != 0) {
      sVar12 = List<Config::OptionBase_*>::size((List<Config::OptionBase_*> *)&i_3);
      shortOpts.mString.field_2._8_8_ =
           StackBuffer<128UL,_option>::operator[]
                     ((StackBuffer<128UL,_option> *)
                      &optionPointers.
                       super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                       super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(int)sVar12);
      List<Config::OptionBase_*>::append((List<Config::OptionBase_*> *)&i_3,(OptionBase **)&o);
      *(undefined8 *)shortOpts.mString.field_2._8_8_ = *(undefined8 *)&o->has_arg;
      TVar8 = Value::type((Value *)&o[1].val);
      *(uint *)(shortOpts.mString.field_2._8_8_ + 8) = (uint)(TVar8 != Type_Boolean);
      *(int *)(shortOpts.mString.field_2._8_8_ + 0x18) = (int)*(char *)&o->flag;
      *(undefined8 *)(shortOpts.mString.field_2._8_8_ + 0x10) = 0;
    }
  }
  sVar12 = List<Config::OptionBase_*>::size((List<Config::OptionBase_*> *)&i_3);
  poVar16 = StackBuffer<128UL,_option>::operator[]
                      ((StackBuffer<128UL,_option> *)
                       &optionPointers.
                        super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                        super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(int)sVar12);
  poVar16->flag = (int *)0x0;
  *(undefined8 *)&poVar16->val = 0;
  poVar16->name = (char *)0x0;
  *(undefined8 *)&poVar16->has_arg = 0;
  poVar16 = StackBuffer::operator_cast_to_option_
                      ((StackBuffer *)
                       &optionPointers.
                        super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                        super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Rct::shortOptions((String *)&idx,poVar16);
  ret._3_1_ = 1;
LAB_0021b193:
  do {
    local_19b0 = -1;
    sVar12 = List<String>::size((List<String> *)local_68);
    ppcVar13 = StackBuffer::operator_cast_to_char__((StackBuffer *)&i_2);
    pcVar11 = String::constData((String *)&idx);
    poVar16 = StackBuffer::operator_cast_to_option_
                        ((StackBuffer *)
                         &optionPointers.
                          super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                          super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar7 = getopt_long(sVar12 & 0xffffffff,ppcVar13,pcVar11,poVar16,&local_19b0);
    if (iVar7 == -1) goto LAB_0021bace;
    if (iVar7 == 0x3f) {
      ret._3_1_ = 0;
      goto LAB_0021bace;
    }
    i_4 = 0;
    if (local_19b0 == -1) {
      for (val.mData._40_8_ = 0; uVar1 = val.mData._40_8_,
          sVar12 = List<Config::OptionBase_*>::size((List<Config::OptionBase_*> *)&i_3),
          (ulong)uVar1 < sVar12; val.mData._40_8_ = val.mData._40_8_ + 1) {
        ppOVar15 = std::vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>::
                   operator[]((vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_> *
                              )&i_3,val.mData._40_8_);
        if ((char)(*ppOVar15)[0x10] == iVar7) {
          ppOVar15 = std::vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>::
                     operator[]((vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                                 *)&i_3,val.mData._40_8_);
          i_4 = (size_t)*ppOVar15;
          break;
        }
      }
    }
    else {
      ppOVar15 = std::vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>::
                 operator[]((vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_> *)
                            &i_3,(long)local_19b0);
      i_4 = (size_t)*ppOVar15;
    }
    if (i_4 == 0) {
      ret._3_1_ = 0;
      goto LAB_0021bace;
    }
    *(long *)(i_4 + 0xb0) = *(long *)(i_4 + 0xb0) + 1;
    if (_optarg == (char *)0x0) {
      TVar8 = Value::type((Value *)(i_4 + 0x38));
      if (TVar8 != Type_Boolean) {
        __assert_fail("opt->defaultValue.type() == Value::Type_Boolean",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Config.cpp"
                      ,0x99,"static bool Config::parse(int, char **, const List<Path> &)");
      }
      bVar4 = Value::toBool((Value *)(i_4 + 0x38));
      Value::Value(&local_1b68,(bool)(~bVar4 & 1));
      Value::operator=((Value *)(i_4 + 0x70),&local_1b68);
      Value::~Value(&local_1b68);
      goto LAB_0021b193;
    }
    Value::Value((Value *)&arg);
    local_1a08 = _optarg;
    if (*_optarg == '=') {
      ppcVar13 = StackBuffer<128UL,_char_*>::operator[]
                           ((StackBuffer<128UL,_char_*> *)&i_2,_optind + -1);
      iVar7 = strcmp(*ppcVar13,_optarg);
      if (iVar7 != 0) {
        local_1a08 = local_1a08 + 1;
      }
    }
    createValue(&local_1a40,*(Type *)(i_4 + 0xa8),local_1a08,(bool *)((long)&ret + 3));
    Value::operator=((Value *)&arg,&local_1a40);
    Value::~Value(&local_1a40);
    pcVar11 = local_1a08;
    if ((ret._3_1_ & 1) == 0) {
      pcVar17 = Value::typeToString(*(Type *)(i_4 + 0xa8));
      String::format<128ul>
                ((String *)
                 &vals.super_vector<Value,_std::allocator<Value>_>.
                  super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,"\"%s\" can not be converted to \"%s\" for %s",pcVar11,pcVar17,
                 *(undefined8 *)(i_4 + 8));
      String::operator=((String *)local_40,
                        (String *)
                        &vals.super_vector<Value,_std::allocator<Value>_>.
                         super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      String::~String((String *)
                      &vals.super_vector<Value,_std::allocator<Value>_>.
                       super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      local_1b2c = 0x15;
    }
    else {
      TVar8 = Value::type((Value *)(i_4 + 0x38));
      if (TVar8 == Type_List) {
        List<Value>::List((List<Value> *)local_1a78);
        List<Value>::operator<<((List<Value> *)local_1a78,(Value *)&arg);
        while( true ) {
          uVar18 = (ulong)_optind;
          sVar12 = List<String>::size((List<String> *)local_68);
          bVar4 = false;
          if (uVar18 < sVar12) {
            ppcVar13 = StackBuffer<128UL,_char_*>::operator[]
                                 ((StackBuffer<128UL,_char_*> *)&i_2,_optind);
            bVar4 = false;
            if ((**ppcVar13 != '-') && (bVar4 = true, *(long *)(i_4 + 0xb8) != 0)) {
              sVar12 = List<Value>::size((List<Value> *)local_1a78);
              bVar4 = sVar12 < *(ulong *)(i_4 + 0xb8);
            }
          }
          if (!bVar4) {
            Value::Value(&local_1b08,(List<Value> *)local_1a78);
            Value::operator=((Value *)(i_4 + 0x70),&local_1b08);
            Value::~Value(&local_1b08);
            if ((*(long *)(i_4 + 0xb8) == 0) ||
               (sVar12 = List<Value>::size((List<Value> *)local_1a78),
               sVar12 == *(size_t *)(i_4 + 0xb8))) {
              local_1b2c = 0;
            }
            else {
              ret._3_1_ = 0;
              uVar1 = *(undefined8 *)(i_4 + 8);
              uVar2 = *(undefined8 *)(i_4 + 0xb8);
              sVar12 = List<Value>::size((List<Value> *)local_1a78);
              String::format<128ul>
                        (&local_1b28,"Too few values specified for %s. Wanted %zu, got %zu",uVar1,
                         uVar2,sVar12);
              String::operator=((String *)local_40,&local_1b28);
              String::~String(&local_1b28);
              local_1b2c = 0x15;
            }
            goto LAB_0021b938;
          }
          TVar8 = *(Type *)(i_4 + 0xa8);
          ppcVar13 = StackBuffer<128UL,_char_*>::operator[]
                               ((StackBuffer<128UL,_char_*> *)&i_2,_optind);
          createValue(&local_1ab0,TVar8,*ppcVar13,(bool *)((long)&ret + 3));
          List<Value>::operator<<((List<Value> *)local_1a78,&local_1ab0);
          Value::~Value(&local_1ab0);
          if ((ret._3_1_ & 1) == 0) break;
          _optind = _optind + 1;
        }
        ppcVar13 = StackBuffer<128UL,_char_*>::operator[]
                             ((StackBuffer<128UL,_char_*> *)&i_2,_optind);
        pcVar11 = *ppcVar13;
        pcVar17 = Value::typeToString(*(Type *)(i_4 + 0xa8));
        String::format<128ul>
                  (&local_1ad0,"\"%s\" can not be converted to \"%s\" for %s",pcVar11,pcVar17,
                   *(undefined8 *)(i_4 + 8));
        String::operator=((String *)local_40,&local_1ad0);
        String::~String(&local_1ad0);
        local_1b2c = 0x15;
LAB_0021b938:
        List<Value>::~List((List<Value> *)local_1a78);
        if (local_1b2c != 0) goto LAB_0021b9c3;
      }
      else {
        Value::operator=((Value *)(i_4 + 0x70),(Value *)&arg);
      }
      bVar6 = (**(code **)(*(long *)i_4 + 0x10))(i_4,local_40);
      if ((bVar6 & 1) == 0) {
        ret._3_1_ = 0;
        local_1b2c = 0x15;
      }
      else {
        local_1b2c = 0;
      }
    }
LAB_0021b9c3:
    Value::~Value((Value *)&arg);
    if (local_1b2c != 0) {
      if (local_1b2c == 0x15) {
LAB_0021bace:
        while (uVar18 = (ulong)_optind, sVar12 = List<String>::size((List<String> *)local_68),
              iVar7 = _optind, uVar18 < sVar12) {
          _optind = _optind + 1;
          ppcVar13 = StackBuffer<128UL,_char_*>::operator[]
                               ((StackBuffer<128UL,_char_*> *)&i_2,iVar7);
          Value::Value(&local_1ba0,*ppcVar13,-1);
          List<Value>::operator<<(&sFreeArgs,&local_1ba0);
          Value::~Value(&local_1ba0);
        }
        if (((sAllowsFreeArgs & 1U) == 0) && (bVar4 = List<Value>::isEmpty(&sFreeArgs), !bVar4)) {
          String::format<128ul>((String *)&i_5,"Unexpected free args");
          String::operator=((String *)local_40,(String *)&i_5);
          String::~String((String *)&i_5);
          ret._3_1_ = 0;
        }
        for (local_1bc8 = 0; sVar12 = List<String>::size((List<String> *)local_68),
            local_1bc8 < sVar12; local_1bc8 = local_1bc8 + 1) {
          ppcVar13 = StackBuffer<128UL,_char_*>::operator[]
                               ((StackBuffer<128UL,_char_*> *)&i_2,(int)local_1bc8);
          free(*ppcVar13);
        }
        if (((ret._3_1_ & 1) == 0) && (bVar4 = String::isEmpty((String *)local_40), !bVar4)) {
          showHelp((FILE *)_stderr);
          __stream = _stderr;
          pcVar11 = String::constData((String *)local_40);
          fprintf(__stream,"%s\n",pcVar11);
        }
        argv_local._7_1_ = ret._3_1_ & 1;
        local_1b2c = 1;
      }
      String::~String((String *)&idx);
      List<Config::OptionBase_*>::~List((List<Config::OptionBase_*> *)&i_3);
      StackBuffer<128UL,_option>::~StackBuffer
                ((StackBuffer<128UL,_option> *)
                 &optionPointers.
                  super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                  super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      StackBuffer<128UL,_char_*>::~StackBuffer((StackBuffer<128UL,_char_*> *)&i_2);
      List<String>::~List((List<String> *)local_68);
      String::~String((String *)local_40);
      return (bool)(argv_local._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool Config::parse(int argc, char **argv, const List<Path> &rcFiles)
{
    String error;
    Rct::findExecutablePath(argv[0]);
    List<String> args;
    args << argv[0];
    for (size_t i=0; i<rcFiles.size(); ++i) {
        FILE *f = fopen(rcFiles.at(i).constData(), "r");
        if (f) {
            char line[1024];
            int read;
            while ((read = Rct::readLine(f, line, sizeof(line))) != -1) {
                char *ch = line;
                while (isspace(*ch))
                    ++ch;
                if (*ch == '#')
                    continue;
                List<String> split = String(ch).split(' '); // ### quoting?
                if (!split.isEmpty()) {
                    String &first = split.first();
                    if (first.size() == 1 || (first.size() > 2 && first.at(1) == '=')) {
                        first.prepend('-');
                    } else {
                        first.prepend("--");
                    }
                    args += split;
                }
            }
            fclose(f);
        }
    }
    for (int i=1; i<argc; ++i)
        args.append(argv[i]);

    // ::error() << "parsing" << args;

    StackBuffer<128, char *> a(args.size());
    for (size_t i=0; i<args.size(); ++i) {
        a[i] = strdup(args.at(i).constData());
    }
    StackBuffer<128, option> options(sOptions.size() + 1);

    List<OptionBase*> optionPointers;
    for (size_t i=0; i<sOptions.size(); ++i) {
        OptionBase *opt = sOptions.at(i);
        if (opt->name) {
            option &o = options[optionPointers.size()];
            optionPointers.append(opt);
            o.name = opt->name;
            o.has_arg = (opt->defaultValue.type() == Value::Type_Boolean) ? no_argument : required_argument; // ### no optional arg?
            o.val = opt->shortOption;
            o.flag = 0;
        }
    }
    memset(&options[optionPointers.size()], 0, sizeof(option));
    const String shortOpts = Rct::shortOptions(options);

    bool ok = true;

    while (true) {
        int idx = -1;
        const int ret = getopt_long(args.size(), a, shortOpts.constData(), options, &idx);
        switch (ret) {
        case -1:
            goto done;
        case '?':
            ok = false;
            goto done;
        default:
            break;
        }
        // error() << optind << ret << optarg;
        // error("%c [%s] [%s]", ret, optarg, a[optind]);

        OptionBase *opt = 0;
        if (idx != -1) {
            opt = optionPointers[idx];
        } else {
            for (size_t i=0; i<optionPointers.size(); ++i) {
                if (optionPointers[i]->shortOption == ret) {
                    opt = optionPointers[i];
                    break;
                }
            }
        }
        if (!opt) {
            ok = false;
            goto done;
        }
        ++opt->count;
        if (optarg) {
            Value val;
            const char *arg = optarg;
            if (optarg[0] == '=' && strcmp(a[optind - 1], optarg)) {
                ++arg;
            }
            val = createValue(opt->type, arg, &ok);
            if (!ok) {
                error = String::format<128>("\"%s\" can not be converted to \"%s\" for %s",
                                            arg, Value::typeToString(opt->type),
                                            opt->name);
                goto done;
            }

            if (opt->defaultValue.type() == Value::Type_List) {
                List<Value> vals;
                vals << val;
                while (static_cast<size_t>(optind) < args.size() && a[optind][0] != '-' && (!opt->listCount || vals.size() < opt->listCount)) {
                    vals << createValue(opt->type, a[optind], &ok);
                    if (!ok) {
                        error = String::format<128>("\"%s\" can not be converted to \"%s\" for %s",
                                                    a[optind], Value::typeToString(opt->type),
                                                    opt->name);
                        goto done;
                    }
                    ++optind;
                }
                opt->value = vals;
                if (opt->listCount && vals.size() != opt->listCount) {
                    ok = false;
#ifdef _WIN32
                    error = String::format<128>("Too few values specified for %s. Wanted %Iu, got %Iu",
#else
                    error = String::format<128>("Too few values specified for %s. Wanted %zu, got %zu",
#endif

                                                opt->name, opt->listCount, vals.size());

                    goto done;
                }
            } else {
                opt->value = val;
            }
            if (!opt->validate(error)) {
                ok = false;
                goto done;
            }
        } else {
            assert(opt->defaultValue.type() == Value::Type_Boolean);
            // must be a toggle arg
            opt->value = Value(!opt->defaultValue.toBool());
        }
    }

done:
    while (static_cast<size_t>(optind) < args.size()) {
        sFreeArgs << a[optind++];
    }
    if (!sAllowsFreeArgs && !sFreeArgs.isEmpty()) {
        error = String::format<128>("Unexpected free args");
        ok = false;
    }

    for (size_t i=0; i<args.size(); ++i) {
        free(a[i]);
    }

    if (!ok) {
        if (!error.isEmpty()) {
            showHelp(stderr);
            fprintf(stderr, "%s\n", error.constData());
        }
    }
    return ok;
}